

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void __thiscall asl::String::split(String *this,String *sep,Array<asl::String> *out)

{
  Array<asl::String> *this_00;
  String local_48;
  int local_30;
  int local_2c;
  int i;
  int n;
  int m;
  int j;
  Array<asl::String> *out_local;
  String *sep_local;
  String *this_local;
  
  _m = out;
  out_local = (Array<asl::String> *)sep;
  sep_local = this;
  Array<asl::String>::clear(out);
  n = 0;
  i = length((String *)out_local);
  local_2c = length(this);
  local_30 = 0;
  while (local_30 <= local_2c) {
    n = indexOf(this,(String *)out_local,local_30);
    this_00 = _m;
    if (n == -1) {
      n = local_2c;
    }
    substring(&local_48,this,local_30,n);
    Array<asl::String>::operator<<(this_00,&local_48);
    ~String(&local_48);
    local_30 = n + i;
  }
  return;
}

Assistant:

void String::split(const String& sep, Array<String>& out) const
{
	out.clear();
	int j=0, m=sep.length(), n=length();
	for(int i=0; i<=n; i=j+m)
	{
		j=indexOf(sep, i);
		if(j==-1) j=n;
		out << substring(i, j);
	}
}